

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

void __thiscall
Eigen::PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::setIdentity
          (PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this,Index newSize)

{
  Index newSize_local;
  PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> *this_local;
  
  resize(this,newSize);
  setIdentity(this);
  return;
}

Assistant:

void setIdentity(Index newSize)
    {
      resize(newSize);
      setIdentity();
    }